

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O3

int xmlRelaxNGValidateElementEnd(xmlRelaxNGValidCtxtPtr ctxt,int dolog)

{
  xmlRelaxNGValidStatePtr pxVar1;
  xmlNodePtr pxVar2;
  long lVar3;
  
  pxVar1 = ctxt->state;
  if (pxVar1->seq != (xmlNodePtr)0x0) {
    pxVar2 = xmlRelaxNGSkipIgnored(ctxt,pxVar1->seq);
    pxVar1->seq = pxVar2;
    if (pxVar2 != (xmlNodePtr)0x0) {
      if (dolog == 0) {
        return -1;
      }
      xmlRelaxNGAddValidError(ctxt,XML_RELAXNG_ERR_EXTRACONTENT,pxVar1->node->name,pxVar2->name,0);
      return -1;
    }
  }
  if (0 < (long)pxVar1->nbAttrs) {
    lVar3 = 0;
    do {
      if (pxVar1->attrs[lVar3] != (xmlAttrPtr)0x0) {
        if (dolog != 0) {
          xmlRelaxNGAddValidError
                    (ctxt,XML_RELAXNG_ERR_INVALIDATTR,pxVar1->attrs[lVar3]->name,pxVar1->node->name,
                     0);
        }
        return ~(uint)lVar3;
      }
      lVar3 = lVar3 + 1;
    } while (pxVar1->nbAttrs != lVar3);
  }
  return 0;
}

Assistant:

static int
xmlRelaxNGValidateElementEnd(xmlRelaxNGValidCtxtPtr ctxt, int dolog)
{
    int i;
    xmlRelaxNGValidStatePtr state;

    state = ctxt->state;
    if (state->seq != NULL) {
        state->seq = xmlRelaxNGSkipIgnored(ctxt, state->seq);
        if (state->seq != NULL) {
            if (dolog) {
                VALID_ERR3(XML_RELAXNG_ERR_EXTRACONTENT,
                           state->node->name, state->seq->name);
            }
            return (-1);
        }
    }
    for (i = 0; i < state->nbAttrs; i++) {
        if (state->attrs[i] != NULL) {
            if (dolog) {
                VALID_ERR3(XML_RELAXNG_ERR_INVALIDATTR,
                           state->attrs[i]->name, state->node->name);
            }
            return (-1 - i);
        }
    }
    return (0);
}